

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O2

void Lib::OutputAll<const_char_*,_unsigned_int,_const_char_*>::apply
               (ostream *out,char *m,uint ms,char *ms_1)

{
  std::operator<<(out,m);
  OutputAll<unsigned_int,_const_char_*>::apply(out,ms,ms_1);
  return;
}

Assistant:

static void apply(std::ostream& out, M m, Ms... ms) {
    out << m;
    OutputAll<Ms...>::apply(out, ms...);
  }